

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::BaseEmitter::commentv(BaseEmitter *this,char *fmt,__va_list_tag *ap)

{
  Error _err;
  Error EVar1;
  ulong uVar2;
  undefined1 *puVar3;
  undefined8 local_438;
  ulong uStack_430;
  undefined8 local_428;
  undefined1 *local_420;
  undefined1 local_418 [1032];
  
  if ((this->_emitterFlags & kLogComments) == kNone) {
    EVar1 = 0;
    if ((this->_emitterFlags & kAttached) == kNone) {
      EVar1 = 5;
      reportError(this,5,(char *)0x0);
    }
  }
  else {
    local_420 = local_418;
    uStack_430 = 0;
    local_438 = 0x20;
    local_428 = 0x407;
    local_418[0] = 0;
    EVar1 = String::_opVFormat((String *)&local_438,kAppend,fmt,ap);
    if (EVar1 == 0) {
      uVar2 = uStack_430;
      puVar3 = local_420;
      if ((local_438 & 0xff) < 0x1f) {
        uVar2 = local_438 & 0xff;
        puVar3 = (undefined1 *)((long)&local_438 + 1);
      }
      EVar1 = (*this->_vptr_BaseEmitter[0xf])(this,puVar3,uVar2);
    }
    String::reset((String *)&local_438);
  }
  return EVar1;
}

Assistant:

Error BaseEmitter::commentv(const char* fmt, va_list ap) {
  if (!hasEmitterFlag(EmitterFlags::kLogComments)) {
    if (!hasEmitterFlag(EmitterFlags::kAttached))
      return reportError(DebugUtils::errored(kErrorNotInitialized));
    return kErrorOk;
  }

#ifndef ASMJIT_NO_LOGGING
  StringTmp<1024> sb;
  Error err = sb.appendVFormat(fmt, ap);

  ASMJIT_PROPAGATE(err);
  return comment(sb.data(), sb.size());
#else
  DebugUtils::unused(fmt, ap);
  return kErrorOk;
#endif
}